

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackgroundCommand.cpp
# Opt level: O2

void __thiscall senjo::GoCommandHandle::Execute(GoCommandHandle *this)

{
  ChessEngine *this_00;
  Output local_50;
  string ponder;
  string bestmove;
  
  this_00 = (this->super_BackgroundCommand).engine;
  if (this_00 == (ChessEngine *)0x0) {
    Output::Output((Output *)&ponder,InfoPrefix);
    std::operator<<((ostream *)&std::cout,"Engine not set for \'go\' command");
    Output::~Output((Output *)&ponder);
  }
  else {
    ChessEngine::_stop = 0;
    ponder._M_dataplus._M_p = (pointer)&ponder.field_2;
    ponder._M_string_length = 0;
    ponder.field_2._M_local_buf[0] = '\0';
    ChessEngine::Go(&bestmove,this_00,this->depth,this->movestogo,this->movetime,this->wtime,
                    this->winc,this->btime,this->binc,&ponder);
    if (bestmove._M_string_length == 0) {
      std::__cxx11::string::assign((char *)&bestmove);
      ponder._M_string_length = 0;
      *ponder._M_dataplus._M_p = '\0';
    }
    if (ponder._M_string_length == 0) {
      Output::Output(&local_50,NoPrefix);
      std::operator<<((ostream *)&std::cout,"bestmove ");
      std::operator<<((ostream *)&std::cout,(string *)&bestmove);
    }
    else {
      Output::Output(&local_50,NoPrefix);
      std::operator<<((ostream *)&std::cout,"bestmove ");
      std::operator<<((ostream *)&std::cout,(string *)&bestmove);
      std::operator<<((ostream *)&std::cout," ponder ");
      std::operator<<((ostream *)&std::cout,(string *)&ponder);
    }
    Output::~Output(&local_50);
    std::__cxx11::string::~string((string *)&bestmove);
    std::__cxx11::string::~string((string *)&ponder);
  }
  return;
}

Assistant:

void GoCommandHandle::Execute()
{
  if (!engine) {
    Output() << "Engine not set for 'go' command";
    return;
  }

  engine->ClearStopFlags();

  std::string ponder; // NOTE: shadows this->ponder
  std::string bestmove =
      engine->Go(depth, movestogo, movetime, wtime, winc, btime, binc, &ponder);

  if (bestmove.empty()) {
    bestmove = "none";
    ponder.clear();
  }

  if (ponder.size()) {
    Output(Output::NoPrefix) << "bestmove " << bestmove << " ponder " << ponder;
  }
  else {
    Output(Output::NoPrefix) << "bestmove " << bestmove;
  }
}